

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint32_t mipsdsp_lshift32(uint32_t a,uint8_t s,CPUMIPSState_conflict5 *env)

{
  int iVar1;
  uint32_t discard;
  CPUMIPSState_conflict5 *env_local;
  uint32_t uStack_c;
  uint8_t s_local;
  uint32_t a_local;
  
  uStack_c = a;
  if (s != '\0') {
    iVar1 = (int)a >> (0x1f - (s + 0xff) & 0x1f);
    if ((iVar1 != 0) && (iVar1 != -1)) {
      set_DSPControl_overflow_flag(1,0x16,env);
    }
    uStack_c = a << (s & 0x1f);
  }
  return uStack_c;
}

Assistant:

static inline uint32_t mipsdsp_lshift32(uint32_t a, uint8_t s,
                                        CPUMIPSState *env)
{
    uint32_t discard;

    if (s == 0) {
        return a;
    } else {
        discard = (int32_t)a >> (31 - (s - 1));

        if ((discard != 0x00000000) && (discard != 0xFFFFFFFF)) {
            set_DSPControl_overflow_flag(1, 22, env);
        }
        return a << s;
    }
}